

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dual_Resampler.cpp
# Opt level: O3

void __thiscall Dual_Resampler::Dual_Resampler(Dual_Resampler *this)

{
  this->_vptr_Dual_Resampler = (_func_int **)&PTR__Dual_Resampler_00712938;
  (this->sample_buf).begin_ = (short *)0x0;
  (this->sample_buf).size_ = 0;
  this->sample_buf_size = 0;
  this->oversamples_per_frame = -1;
  this->buf_pos = -1;
  this->resampler_size = 0;
  Fir_Resampler_::Fir_Resampler_
            (&(this->resampler).super_Fir_Resampler_,0xc,(this->resampler).impulses[0]);
  return;
}

Assistant:

Dual_Resampler::Dual_Resampler() :
	sample_buf_size(0),
	oversamples_per_frame(-1),
	buf_pos(-1),
	resampler_size(0)
{
}